

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedList.h
# Opt level: O0

void __thiscall LinkedList<Transaction_*>::~LinkedList(LinkedList<Transaction_*> *this)

{
  int local_24;
  Node<Transaction_*> *pNStack_20;
  int i;
  Node<Transaction_*> *currNext;
  Node<Transaction_*> *curr;
  LinkedList<Transaction_*> *this_local;
  
  currNext = this->head;
  pNStack_20 = currNext->next;
  for (local_24 = 0; local_24 < this->size; local_24 = local_24 + 1) {
    if (currNext != (Node<Transaction_*> *)0x0) {
      operator_delete(currNext,0x10);
    }
    currNext = pNStack_20;
    if (pNStack_20 != (Node<Transaction_*> *)0x0) {
      pNStack_20 = pNStack_20->next;
    }
  }
  return;
}

Assistant:

LinkedList<T>::~LinkedList()
{
    auto curr = this->head;
    auto currNext = curr->next;

    for(int i = 0; i < size; i++)
    {
        delete curr;
        curr = currNext;
        if(curr != nullptr)
        {
            currNext = curr->next;
        }
    }
}